

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
Service_AddNodes_existing
          (UA_Server *server,UA_Session *session,UA_Node *node,UA_NodeId *parentNodeId,
          UA_NodeId *referenceTypeId,UA_NodeId *typeDefinition,
          UA_InstantiationCallback *instantiationCallback,UA_NodeId *addedNodeId)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  UA_NodeClass UVar9;
  uint uVar10;
  UA_NodeStore *ns;
  UA_SecureChannel *pUVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  size_t sVar15;
  UA_Boolean UVar16;
  UA_StatusCode UVar17;
  UA_StatusCode UVar18;
  UA_NodeStoreEntry **ppUVar19;
  UA_Node *pUVar20;
  long lVar21;
  undefined1 deleteReferences;
  ulong uVar22;
  char *pcVar23;
  UA_AddReferencesItem *item;
  UA_Node *pUVar24;
  ulong uVar25;
  UA_Logger p_Var26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  undefined1 auStack_148 [8];
  UA_NodeId subtypeId;
  undefined1 local_c8 [8];
  UA_NodeId id_1;
  UA_NodeId basedatavariabletype;
  UA_NodeId baseobjecttype;
  UA_SecureChannel *local_70;
  ContinuationPointList local_60;
  UA_ListOfUASubscriptions local_50;
  UA_PublishResponseEntry *local_48;
  ulong local_38;
  
  if (server->namespacesSize <= (ulong)(node->nodeId).namespaceIndex) {
    pUVar11 = session->channel;
    uVar27 = 0;
    uVar22 = 0;
    if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
      uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
    }
    if (pUVar11 != (UA_SecureChannel *)0x0) {
      uVar27 = (ulong)(pUVar11->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Namespace invalid"
                ,uVar22,uVar27,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7]);
    UA_NodeStore_deleteNode(node);
    return 0x80330000;
  }
  UVar9 = node->nodeClass;
  if ((UVar9 == UA_NODECLASS_OBJECT) && (UVar16 = UA_NodeId_isNull(parentNodeId), UVar16)) {
    UVar16 = UA_NodeId_isNull(referenceTypeId);
    UVar17 = 0;
    if (!UVar16) goto LAB_001204c4;
  }
  else {
LAB_001204c4:
    ns = server->nodestore;
    ppUVar19 = findNode(ns,parentNodeId);
    if (ppUVar19 == (UA_NodeStoreEntry **)0x0) {
      pUVar24 = (UA_Node *)0x0;
    }
    else {
      pUVar24 = &(*ppUVar19)->node;
    }
    if (pUVar24 == (UA_Node *)0x0) {
      pUVar11 = session->channel;
      uVar27 = 0;
      uVar22 = 0;
      if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
        uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
      }
      p_Var26 = (server->config).logger;
      if (pUVar11 != (UA_SecureChannel *)0x0) {
        uVar27 = (ulong)(pUVar11->securityToken).channelId;
      }
      uVar10 = (session->sessionId).identifier.numeric;
      uVar8 = (session->sessionId).identifier.guid.data2;
      local_50.lh_first._0_2_ = (session->sessionId).identifier.guid.data3;
      bVar1 = (session->sessionId).identifier.guid.data4[0];
      local_60.lh_first._0_1_ = (session->sessionId).identifier.guid.data4[1];
      bVar2 = (session->sessionId).identifier.guid.data4[2];
      bVar3 = (session->sessionId).identifier.guid.data4[3];
      bVar4 = (session->sessionId).identifier.guid.data4[4];
      bVar5 = (session->sessionId).identifier.guid.data4[5];
      bVar6 = (session->sessionId).identifier.guid.data4[6];
      bVar7 = (session->sessionId).identifier.guid.data4[7];
      pcVar23 = 
      "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Parent node not found"
      ;
LAB_001206a0:
      local_38 = (ulong)uVar8;
      local_48 = (UA_PublishResponseEntry *)(ulong)bVar1;
      local_50.lh_first._2_6_ = 0;
      local_60.lh_first._1_7_ = 0;
      UA_LOG_INFO(p_Var26,UA_LOGCATEGORY_SESSION,pcVar23,uVar22,uVar27,(ulong)uVar10,local_38,
                  local_50.lh_first,local_48,local_60.lh_first,(ulong)bVar2,(ulong)bVar3,
                  (ulong)bVar4,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7);
      UVar17 = 0x805b0000;
    }
    else {
      ppUVar19 = findNode(ns,referenceTypeId);
      if (ppUVar19 == (UA_NodeStoreEntry **)0x0) {
        pUVar20 = (UA_Node *)0x0;
      }
      else {
        pUVar20 = &(*ppUVar19)->node;
      }
      if (pUVar20 == (UA_Node *)0x0) {
        pUVar11 = session->channel;
        uVar27 = 0;
        uVar22 = 0;
        if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
          uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
        }
        p_Var26 = (server->config).logger;
        if (pUVar11 != (UA_SecureChannel *)0x0) {
          uVar27 = (ulong)(pUVar11->securityToken).channelId;
        }
        uVar28 = (ulong)(session->sessionId).identifier.numeric;
        local_38 = (ulong)(session->sessionId).identifier.guid.data2;
        local_50.lh_first = (UA_Subscription *)(ulong)(session->sessionId).identifier.guid.data3;
        local_48 = (UA_PublishResponseEntry *)(ulong)(session->sessionId).identifier.guid.data4[0];
        local_60.lh_first =
             (ContinuationPointEntry *)(ulong)(session->sessionId).identifier.guid.data4[1];
        uVar34 = (ulong)(session->sessionId).identifier.guid.data4[2];
        uVar31 = (ulong)(session->sessionId).identifier.guid.data4[3];
        uVar32 = (ulong)(session->sessionId).identifier.guid.data4[4];
        uVar29 = (ulong)(session->sessionId).identifier.guid.data4[5];
        uVar30 = (ulong)(session->sessionId).identifier.guid.data4[6];
        uVar25 = (ulong)(session->sessionId).identifier.guid.data4[7];
        pcVar23 = 
        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type to the parent not found"
        ;
      }
      else {
        if (pUVar20->nodeClass == UA_NODECLASS_REFERENCETYPE) {
          if (*(char *)(pUVar20 + 1) == '\x01') {
            pUVar11 = session->channel;
            uVar27 = 0;
            uVar22 = 0;
            if ((pUVar11 != (UA_SecureChannel *)0x0) &&
               (pUVar11->connection != (UA_Connection *)0x0)) {
              uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
            }
            p_Var26 = (server->config).logger;
            if (pUVar11 != (UA_SecureChannel *)0x0) {
              uVar27 = (ulong)(pUVar11->securityToken).channelId;
            }
            uVar10 = (session->sessionId).identifier.numeric;
            uVar8 = (session->sessionId).identifier.guid.data2;
            local_50.lh_first._0_2_ = (session->sessionId).identifier.guid.data3;
            bVar1 = (session->sessionId).identifier.guid.data4[0];
            local_60.lh_first._0_1_ = (session->sessionId).identifier.guid.data4[1];
            bVar2 = (session->sessionId).identifier.guid.data4[2];
            bVar3 = (session->sessionId).identifier.guid.data4[3];
            bVar4 = (session->sessionId).identifier.guid.data4[4];
            bVar5 = (session->sessionId).identifier.guid.data4[5];
            bVar6 = (session->sessionId).identifier.guid.data4[6];
            bVar7 = (session->sessionId).identifier.guid.data4[7];
            pcVar23 = 
            "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Abstract reference type to the parent not allowed"
            ;
LAB_00120abb:
            local_38 = (ulong)uVar8;
            local_48 = (UA_PublishResponseEntry *)(ulong)bVar1;
            local_50.lh_first._2_6_ = 0;
            local_60.lh_first._1_7_ = 0;
            UA_LOG_INFO(p_Var26,UA_LOGCATEGORY_SESSION,pcVar23,uVar22,uVar27,(ulong)uVar10,local_38,
                        local_50.lh_first,local_48,local_60.lh_first,(ulong)bVar2,(ulong)bVar3,
                        (ulong)bVar4,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7);
            UVar17 = 0x805c0000;
          }
          else {
            auStack_148._0_2_ = 0;
            auStack_148._4_4_ = UA_NODEIDTYPE_NUMERIC;
            subtypeId.namespaceIndex = 0x2d;
            subtypeId._2_2_ = 0;
            uVar10 = UVar9 - UA_NODECLASS_OBJECTTYPE >> 3;
            if (((UVar9 << 0x1d | uVar10) < 8) && ((0x8bU >> (uVar10 & 0x1f) & 1) != 0)) {
              UVar16 = UA_NodeId_equal(referenceTypeId,(UA_NodeId *)auStack_148);
              if (!UVar16) {
                pUVar11 = session->channel;
                uVar27 = 0;
                uVar22 = 0;
                if ((pUVar11 != (UA_SecureChannel *)0x0) &&
                   (pUVar11->connection != (UA_Connection *)0x0)) {
                  uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
                }
                p_Var26 = (server->config).logger;
                if (pUVar11 != (UA_SecureChannel *)0x0) {
                  uVar27 = (ulong)(pUVar11->securityToken).channelId;
                }
                uVar10 = (session->sessionId).identifier.numeric;
                uVar8 = (session->sessionId).identifier.guid.data2;
                local_50.lh_first._0_2_ = (session->sessionId).identifier.guid.data3;
                bVar1 = (session->sessionId).identifier.guid.data4[0];
                local_60.lh_first._0_1_ = (session->sessionId).identifier.guid.data4[1];
                bVar2 = (session->sessionId).identifier.guid.data4[2];
                bVar3 = (session->sessionId).identifier.guid.data4[3];
                bVar4 = (session->sessionId).identifier.guid.data4[4];
                bVar5 = (session->sessionId).identifier.guid.data4[5];
                bVar6 = (session->sessionId).identifier.guid.data4[6];
                bVar7 = (session->sessionId).identifier.guid.data4[7];
                pcVar23 = 
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: New type node need to have a HasSubType reference"
                ;
                goto LAB_00120abb;
              }
              UVar17 = 0;
              if (pUVar24->nodeClass != UVar9) {
                pUVar11 = session->channel;
                uVar27 = 0;
                uVar22 = 0;
                if ((pUVar11 != (UA_SecureChannel *)0x0) &&
                   (pUVar11->connection != (UA_Connection *)0x0)) {
                  uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
                }
                p_Var26 = (server->config).logger;
                if (pUVar11 != (UA_SecureChannel *)0x0) {
                  uVar27 = (ulong)(pUVar11->securityToken).channelId;
                }
                uVar10 = (session->sessionId).identifier.numeric;
                uVar8 = (session->sessionId).identifier.guid.data2;
                local_50.lh_first._0_2_ = (session->sessionId).identifier.guid.data3;
                bVar1 = (session->sessionId).identifier.guid.data4[0];
                local_60.lh_first._0_1_ = (session->sessionId).identifier.guid.data4[1];
                bVar2 = (session->sessionId).identifier.guid.data4[2];
                bVar3 = (session->sessionId).identifier.guid.data4[3];
                bVar4 = (session->sessionId).identifier.guid.data4[4];
                bVar5 = (session->sessionId).identifier.guid.data4[5];
                bVar6 = (session->sessionId).identifier.guid.data4[6];
                bVar7 = (session->sessionId).identifier.guid.data4[7];
                pcVar23 = 
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: New type node needs to be of the same node type as the parent"
                ;
                goto LAB_001206a0;
              }
            }
            else {
              local_c8._0_2_ = 0;
              stack0xffffffffffffff3c = 0x2100000000;
              UVar16 = isNodeInTree(ns,referenceTypeId,(UA_NodeId *)local_c8,
                                    (UA_NodeId *)auStack_148,1);
              UVar17 = 0;
              if (!UVar16) {
                pUVar11 = session->channel;
                uVar27 = 0;
                uVar22 = 0;
                if ((pUVar11 != (UA_SecureChannel *)0x0) &&
                   (pUVar11->connection != (UA_Connection *)0x0)) {
                  uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
                }
                p_Var26 = (server->config).logger;
                if (pUVar11 != (UA_SecureChannel *)0x0) {
                  uVar27 = (ulong)(pUVar11->securityToken).channelId;
                }
                uVar28 = (ulong)(session->sessionId).identifier.numeric;
                local_38 = (ulong)(session->sessionId).identifier.guid.data2;
                local_50.lh_first =
                     (UA_Subscription *)(ulong)(session->sessionId).identifier.guid.data3;
                local_48 = (UA_PublishResponseEntry *)
                           (ulong)(session->sessionId).identifier.guid.data4[0];
                local_60.lh_first =
                     (ContinuationPointEntry *)(ulong)(session->sessionId).identifier.guid.data4[1];
                uVar34 = (ulong)(session->sessionId).identifier.guid.data4[2];
                uVar31 = (ulong)(session->sessionId).identifier.guid.data4[3];
                uVar32 = (ulong)(session->sessionId).identifier.guid.data4[4];
                uVar29 = (ulong)(session->sessionId).identifier.guid.data4[5];
                uVar30 = (ulong)(session->sessionId).identifier.guid.data4[6];
                uVar25 = (ulong)(session->sessionId).identifier.guid.data4[7];
                pcVar23 = 
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type is not hierarchical"
                ;
                goto LAB_001208cf;
              }
            }
          }
          goto LAB_00120af0;
        }
        pUVar11 = session->channel;
        uVar27 = 0;
        uVar22 = 0;
        if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
          uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
        }
        p_Var26 = (server->config).logger;
        if (pUVar11 != (UA_SecureChannel *)0x0) {
          uVar27 = (ulong)(pUVar11->securityToken).channelId;
        }
        uVar28 = (ulong)(session->sessionId).identifier.numeric;
        local_38 = (ulong)(session->sessionId).identifier.guid.data2;
        local_50.lh_first = (UA_Subscription *)(ulong)(session->sessionId).identifier.guid.data3;
        local_48 = (UA_PublishResponseEntry *)(ulong)(session->sessionId).identifier.guid.data4[0];
        local_60.lh_first =
             (ContinuationPointEntry *)(ulong)(session->sessionId).identifier.guid.data4[1];
        uVar34 = (ulong)(session->sessionId).identifier.guid.data4[2];
        uVar31 = (ulong)(session->sessionId).identifier.guid.data4[3];
        uVar32 = (ulong)(session->sessionId).identifier.guid.data4[4];
        uVar29 = (ulong)(session->sessionId).identifier.guid.data4[5];
        uVar30 = (ulong)(session->sessionId).identifier.guid.data4[6];
        uVar25 = (ulong)(session->sessionId).identifier.guid.data4[7];
        pcVar23 = 
        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type to the parent invalid"
        ;
      }
LAB_001208cf:
      UA_LOG_INFO(p_Var26,UA_LOGCATEGORY_SESSION,pcVar23,uVar22,uVar27,uVar28,local_38,
                  local_50.lh_first,local_48,local_60.lh_first,uVar34,uVar31,uVar32,uVar29,uVar30,
                  uVar25);
      UVar17 = 0x804c0000;
    }
  }
LAB_00120af0:
  if (UVar17 != 0) {
    pUVar11 = session->channel;
    uVar27 = 0;
    uVar22 = 0;
    if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
      uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
    }
    if (pUVar11 != (UA_SecureChannel *)0x0) {
      uVar27 = (ulong)(pUVar11->securityToken).channelId;
    }
    lVar21 = 0;
    lVar33 = 0x142ba0;
    do {
      if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar21) == UVar17) {
        lVar33 = (long)&statusCodeDescriptions[0].code + lVar21;
        break;
      }
      lVar21 = lVar21 + 0x18;
    } while (lVar21 != 0x1578);
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Checking the reference to the parent returned error code %s"
                ,uVar22,uVar27,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7],*(undefined8 *)(lVar33 + 8));
    UA_NodeStore_deleteNode(node);
    return UVar17;
  }
  UVar17 = UA_NodeStore_insert(server->nodestore,node);
  if (UVar17 != 0) {
    pUVar11 = session->channel;
    uVar27 = 0;
    uVar22 = 0;
    if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
      uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
    }
    if (pUVar11 != (UA_SecureChannel *)0x0) {
      uVar27 = (ulong)(pUVar11->securityToken).channelId;
    }
    lVar21 = 0;
    lVar33 = 0x142ba0;
    do {
      if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar21) == UVar17) {
        lVar33 = (long)&statusCodeDescriptions[0].code + lVar21;
        break;
      }
      lVar21 = lVar21 + 0x18;
    } while (lVar21 != 0x1578);
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Node could not be added to the nodestore with error code %s"
                ,uVar22,uVar27,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7],*(undefined8 *)(lVar33 + 8));
    return UVar17;
  }
  if ((addedNodeId == (UA_NodeId *)0x0) ||
     (UVar17 = UA_copy(node,addedNodeId,UA_TYPES + 0x10), UVar17 == 0)) {
    UVar16 = UA_NodeId_isNull(parentNodeId);
    if (!UVar16) {
      subtypeId.identifier.string.length = (size_t)(node->nodeId).identifier.string.data;
      uVar12 = (node->nodeId).namespaceIndex;
      uVar13 = *(undefined2 *)&(node->nodeId).field_0x2;
      uVar14 = (node->nodeId).identifierType;
      sVar15 = (node->nodeId).identifier.string.length;
      subtypeId._0_4_ = SUB84(sVar15,0);
      subtypeId.identifierType = (UA_NodeIdType)(sVar15 >> 0x20);
      subtypeId.identifier.string.data = (UA_Byte *)*(undefined8 *)referenceTypeId;
      auStack_148._0_2_ = uVar12;
      auStack_148._2_2_ = uVar13;
      auStack_148._4_4_ = uVar14;
      UVar17 = addReference(server,(UA_Session *)auStack_148,item);
      if (UVar17 != 0) {
        pUVar11 = session->channel;
        uVar27 = 0;
        uVar22 = 0;
        if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
          uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
        }
        if (pUVar11 != (UA_SecureChannel *)0x0) {
          uVar27 = (ulong)(pUVar11->securityToken).channelId;
        }
        lVar33 = 0;
        lVar21 = 0x142ba0;
        do {
          if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar33) == UVar17) {
            lVar21 = (long)&statusCodeDescriptions[0].code + lVar33;
            break;
          }
          lVar33 = lVar33 + 0x18;
        } while (lVar33 != 0x1578);
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not add the reference to the parentwith error code %s"
                    ,uVar22,uVar27,(ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],
                    (ulong)(session->sessionId).identifier.guid.data4[1],
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7],*(undefined8 *)(lVar21 + 8)
                   );
        deleteReferences = (undefined1)uVar22;
        if (UVar17 != 0) goto LAB_00121290;
      }
    }
    UVar17 = 0;
    id_1.identifier._8_2_ = 0;
    stack0xffffffffffffff54 = 0x3f00000000;
    basedatavariabletype.identifier._8_2_ = 0;
    stack0xffffffffffffff6c = 0x3a00000000;
    UVar9 = node->nodeClass;
    local_70 = (UA_SecureChannel *)typeDefinition;
    if (UVar9 - UA_NODECLASS_OBJECT < 2) {
      if ((typeDefinition == (UA_NodeId *)0x0) ||
         (UVar16 = UA_NodeId_isNull(typeDefinition), UVar16)) {
        local_70 = (UA_SecureChannel *)((long)&basedatavariabletype.identifier + 8);
        if (UVar9 == UA_NODECLASS_VARIABLE) {
          local_70 = (UA_SecureChannel *)((long)&id_1.identifier + 8);
        }
      }
      UVar18 = instantiateNode(server,session,&node->nodeId,UVar9,(UA_NodeId *)local_70,
                               instantiationCallback);
      if (UVar18 != 0) {
        pUVar11 = session->channel;
        uVar27 = 0;
        uVar22 = 0;
        if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
          uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
        }
        if (pUVar11 != (UA_SecureChannel *)0x0) {
          uVar27 = (ulong)(pUVar11->securityToken).channelId;
        }
        lVar33 = 0;
        lVar21 = 0x142ba0;
        do {
          if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar33) == UVar18) {
            lVar21 = (long)&statusCodeDescriptions[0].code + lVar33;
            break;
          }
          lVar33 = lVar33 + 0x18;
        } while (lVar33 != 0x1578);
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not instantiate the node witherror code %s"
                    ,uVar22,uVar27,(ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],
                    (ulong)(session->sessionId).identifier.guid.data4[1],
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7],*(undefined8 *)(lVar21 + 8)
                   );
        deleteReferences = (undefined1)uVar22;
        UVar17 = UVar18;
        goto LAB_00121290;
      }
    }
    if (instantiationCallback != (UA_InstantiationCallback *)0x0) {
      (*instantiationCallback->method)
                (node->nodeId,*(UA_NodeId *)local_70,instantiationCallback->handle);
    }
  }
  else {
    pUVar11 = session->channel;
    uVar27 = 0;
    uVar22 = 0;
    if ((pUVar11 != (UA_SecureChannel *)0x0) && (pUVar11->connection != (UA_Connection *)0x0)) {
      uVar22 = (ulong)(uint)pUVar11->connection->sockfd;
    }
    if (pUVar11 != (UA_SecureChannel *)0x0) {
      uVar27 = (ulong)(pUVar11->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not copy the nodeid"
                ,uVar22,uVar27,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7]);
    deleteReferences = (undefined1)uVar22;
LAB_00121290:
    deleteNode(server,(UA_Session *)node,(UA_NodeId *)0x1,(UA_Boolean)deleteReferences);
  }
  return UVar17;
}

Assistant:

UA_StatusCode
Service_AddNodes_existing(UA_Server *server, UA_Session *session, UA_Node *node,
                          const UA_NodeId *parentNodeId, const UA_NodeId *referenceTypeId,
                          const UA_NodeId *typeDefinition,
                          UA_InstantiationCallback *instantiationCallback,
                          UA_NodeId *addedNodeId) {
    UA_ASSERT_RCU_LOCKED();

    /* Check the namespaceindex */
    if(node->nodeId.namespaceIndex >= server->namespacesSize) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "AddNodes: Namespace invalid");
        UA_NodeStore_deleteNode(node);
        return UA_STATUSCODE_BADNODEIDINVALID;
    }

    /* Check the reference to the parent */
    UA_StatusCode retval = checkParentReference(server, session, node->nodeClass,
                                                parentNodeId, referenceTypeId);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "AddNodes: Checking the reference to the parent returned "
                            "error code %s", UA_StatusCode_name(retval));
        UA_NodeStore_deleteNode(node);
        return retval;
    }

    /* Add the node to the nodestore */
    retval = UA_NodeStore_insert(server->nodestore, node);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "AddNodes: Node could not be added to the nodestore "
                            "with error code %s", UA_StatusCode_name(retval));
        return retval;
    }

    /* Copy the nodeid if needed */
    if(addedNodeId) {
        retval = UA_NodeId_copy(&node->nodeId, addedNodeId);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not copy the nodeid");
            goto remove_node;
        }
    }

    /* Hierarchical reference back to the parent */
    if(!UA_NodeId_isNull(parentNodeId)) {
        UA_AddReferencesItem item;
        UA_AddReferencesItem_init(&item);
        item.sourceNodeId = node->nodeId;
        item.referenceTypeId = *referenceTypeId;
        item.isForward = false;
        item.targetNodeId.nodeId = *parentNodeId;
        retval = addReference(server, session, &item);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not add the reference to the parent"
                                "with error code %s", UA_StatusCode_name(retval));
            goto remove_node;
        }
    }

    /* Fall back to a default typedefinition for variables and objects */
    const UA_NodeId basedatavariabletype = UA_NODEID_NUMERIC(0, UA_NS0ID_BASEDATAVARIABLETYPE);
    const UA_NodeId baseobjecttype = UA_NODEID_NUMERIC(0, UA_NS0ID_BASEOBJECTTYPE);
    if(node->nodeClass == UA_NODECLASS_VARIABLE ||
       node->nodeClass == UA_NODECLASS_OBJECT) {
        if(!typeDefinition || UA_NodeId_isNull(typeDefinition)) {
            if(node->nodeClass == UA_NODECLASS_VARIABLE)
                typeDefinition = &basedatavariabletype;
            else
                typeDefinition = &baseobjecttype;
        }

        /* Instantiate variables and objects */
        retval = instantiateNode(server, session, &node->nodeId, node->nodeClass,
                                 typeDefinition, instantiationCallback);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not instantiate the node with"
                                "error code %s", UA_StatusCode_name(retval));
            goto remove_node;
        }
    }

    /* Custom callback */
    if(instantiationCallback)
        instantiationCallback->method(node->nodeId, *typeDefinition,
                                      instantiationCallback->handle);
    return UA_STATUSCODE_GOOD;

 remove_node:
    deleteNode(server, &adminSession, &node->nodeId, true);
    return retval;
}